

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O0

void __thiscall kj::ExceptionImpl::ExceptionImpl(ExceptionImpl *this,Exception *other)

{
  Exception *other_00;
  Exception *other_local;
  ExceptionImpl *this_local;
  
  other_00 = mv<kj::Exception>(other);
  Exception::Exception(&this->super_Exception,other_00);
  std::exception::exception(&this->super_exception);
  *(undefined ***)this = &PTR__ExceptionImpl_002e35f8;
  String::String(&this->whatBuffer);
  return;
}

Assistant:

inline ExceptionImpl(Exception&& other): Exception(mv(other)) {}